

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

bool __thiscall QRenderRule::hasModification(QRenderRule *this)

{
  QStyleSheetBackgroundData *pQVar1;
  Data *pDVar2;
  bool bVar3;
  undefined4 in_ECX;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  
  bVar5 = true;
  if ((this->pal).d.ptr == (QStyleSheetPaletteData *)0x0) {
    bVar3 = hasBackground(this);
    if ((!bVar3) &&
       ((pQVar1 = (this->bg).d.ptr, pQVar1 == (QStyleSheetBackgroundData *)0x0 ||
        (2 < *(int *)(*(long *)&pQVar1->brush + 4) - 0xfU)))) {
      bVar3 = hasNativeBorder(this);
      if (bVar3) {
        bVar3 = hasNativeOutline(this);
        auVar6._0_4_ = -(uint)(*(int *)&(this->b).d.ptr == 0 && *(int *)&(this->geo).d.ptr == 0);
        auVar6._4_4_ = -(uint)(*(int *)((long)&(this->b).d.ptr + 4) == 0 &&
                              *(int *)((long)&(this->geo).d.ptr + 4) == 0);
        auVar6._8_4_ = -(uint)(*(int *)&(this->img).d.ptr == 0 &&
                              *(int *)&(this->iconPtr).d.ptr == 0);
        auVar6._12_4_ =
             -(uint)(*(int *)((long)&(this->img).d.ptr + 4) == 0 &&
                    *(int *)((long)&(this->iconPtr).d.ptr + 4) == 0);
        iVar4 = movmskps(in_ECX,auVar6);
        if ((iVar4 == 0xf && bVar3) && (this->hasFont == false)) {
          pDVar2 = (this->styleHints).d;
          if (pDVar2 == (Data *)0x0) {
            bVar5 = false;
          }
          else {
            bVar5 = pDVar2->size != 0;
          }
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool QRenderRule::hasModification() const
{
    return hasPalette() ||
           hasBackground() ||
           hasGradientBackground() ||
           !hasNativeBorder() ||
           !hasNativeOutline() ||
           hasBox() ||
           hasPosition() ||
           hasGeometry() ||
           hasImage() ||
           hasFont ||
           !styleHints.isEmpty();
}